

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

void google::protobuf::CleanStringLineEndings(string *src,string *dst,bool auto_end_last_line)

{
  pointer pcVar1;
  string tmp;
  string local_40;
  
  if (dst->_M_string_length != 0) {
    pcVar1 = (src->_M_dataplus)._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + src->_M_string_length);
    CleanStringLineEndings(&local_40,auto_end_last_line);
    std::__cxx11::string::_M_append((char *)dst,(ulong)local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::__cxx11::string::_M_append((char *)dst,(ulong)(src->_M_dataplus)._M_p);
  CleanStringLineEndings(dst,auto_end_last_line);
  return;
}

Assistant:

void CleanStringLineEndings(const std::string &src, std::string *dst,
                            bool auto_end_last_line) {
  if (dst->empty()) {
    dst->append(src);
    CleanStringLineEndings(dst, auto_end_last_line);
  } else {
    std::string tmp = src;
    CleanStringLineEndings(&tmp, auto_end_last_line);
    dst->append(tmp);
  }
}